

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O0

void __thiscall
xLearn::FMScore::calc_grad_adagrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  index_t iVar8;
  pointer pNVar9;
  real_t *prVar10;
  uint uVar11;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  undefined1 auVar15 [16];
  real_t rVar12;
  float fVar13;
  double dVar14;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float in_XMM1_Da;
  __m128 XMMg;
  __m128 XMMwg;
  __m128 XMMw_1;
  __m128 XMMs_1;
  index_t d_1;
  __m128 XMMpgv;
  __m128 XMMv_1;
  real_t *w_2;
  real_t v1_1;
  index_t j1_1;
  const_iterator iter_2;
  __m128 XMMw;
  __m128 XMMs;
  index_t d;
  __m128 XMMv;
  real_t *w_1;
  real_t v1;
  index_t j1;
  const_iterator iter_1;
  real_t *s;
  vector<float,_std::allocator<float>_> sv;
  __m128 XMMlamb;
  __m128 XMMlr;
  __m128 XMMpg;
  index_t align0;
  index_t aligned_k;
  real_t g;
  real_t *wbg;
  real_t *wb;
  real_t g_1;
  real_t *wlg;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  undefined1 in_stack_fffffffffffff938 [16];
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  float in_stack_fffffffffffff950;
  float in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_618;
  undefined8 uStack_610;
  uint local_47c;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  uint local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  real_t *local_3f0;
  float local_3e8;
  uint local_3e4;
  Node *local_3e0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_3d8;
  float *local_3d0;
  undefined4 local_3b4;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  index_t local_358;
  float local_354;
  real_t *local_350;
  real_t *local_348;
  float local_33c;
  real_t *local_338;
  real_t *local_330;
  uint local_324;
  Node *local_320;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_318;
  index_t local_30c;
  real_t *local_308;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  Model *local_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_244;
  real_t *local_240;
  undefined1 (*local_238) [16];
  undefined1 (*local_230) [16];
  real_t *local_228;
  float *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  real_t *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  real_t *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_2f8 = in_XMM1_Da;
  local_2f4 = in_XMM0_Da;
  local_2f0 = in_RDX;
  dVar14 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_2fc = SUB84(dVar14,0);
  local_308 = Model::GetParameter_w(local_2f0);
  local_30c = Model::GetNumFeature(local_2f0);
  local_318._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffff938._0_8_);
  while( true ) {
    local_320 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffff938._0_8_);
    bVar7 = __gnu_cxx::operator!=(in_stack_fffffffffffff938._8_8_,in_stack_fffffffffffff938._0_8_);
    if (!bVar7) break;
    pNVar9 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_318);
    fVar13 = local_2f4;
    local_324 = *(uint *)(pNVar9 + 4);
    if (local_324 < local_30c) {
      local_330 = local_308 + (local_324 << 1);
      local_338 = local_308 + (local_324 * 2 + 1);
      uVar11 = *(uint *)(in_RDI + 0xc);
      rVar12 = *local_330;
      pNVar9 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_318);
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)rVar12),ZEXT416(uVar11),
                                ZEXT416((uint)(fVar13 * *(float *)(pNVar9 + 8) * local_2fc)));
      local_33c = auVar15._0_4_;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)local_33c),ZEXT416((uint)local_33c),
                                ZEXT416((uint)*local_338));
      *local_338 = auVar15._0_4_;
      fVar13 = *(float *)(in_RDI + 8) * local_33c;
      auVar16._0_4_ = InvSqrt(*local_338);
      auVar16._4_60_ = extraout_var;
      auVar15 = vfmadd213ss_fma(auVar16._0_16_,ZEXT416((uint)-fVar13),ZEXT416((uint)*local_330));
      *local_330 = auVar15._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_318);
  }
  local_348 = Model::GetParameter_b(local_2f0);
  local_350 = local_348 + 1;
  local_354 = local_2f4;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)local_2f4),ZEXT416((uint)local_2f4),
                            ZEXT416((uint)*local_350));
  *local_350 = auVar15._0_4_;
  fVar13 = *(float *)(in_RDI + 8) * local_2f4;
  local_308 = local_348;
  auVar17._0_4_ = InvSqrt(*local_350);
  auVar17._4_60_ = extraout_var_00;
  auVar15 = vfnmadd213ss_fma(auVar17._0_16_,ZEXT416((uint)fVar13),ZEXT416((uint)*local_348));
  *local_348 = auVar15._0_4_;
  local_358 = Model::get_aligned_k((Model *)0x1aacb0);
  iVar8 = Model::get_aligned_k((Model *)0x1aacc4);
  auVar15 = vcvtusi2ss_avx512f(auVar15,iVar8);
  rVar12 = Model::GetAuxiliarySize(local_2f0);
  local_35c = vcvttss2usi_avx512f(ZEXT416((uint)(auVar15._0_4_ * rVar12)));
  local_244 = local_2f4;
  local_258 = local_2f4;
  fStack_254 = local_2f4;
  fStack_250 = local_2f4;
  fStack_24c = local_2f4;
  local_378 = CONCAT44(local_2f4,local_2f4);
  uStack_370 = CONCAT44(local_2f4,local_2f4);
  local_278 = *(undefined4 *)(in_RDI + 8);
  local_388 = CONCAT44(local_278,local_278);
  uStack_380 = CONCAT44(local_278,local_278);
  local_298 = *(undefined4 *)(in_RDI + 0xc);
  local_398 = CONCAT44(local_298,local_298);
  uStack_390 = CONCAT44(local_298,local_298);
  local_3b4 = 0;
  uStack_294 = local_298;
  uStack_290 = local_298;
  uStack_28c = local_298;
  local_27c = local_298;
  uStack_274 = local_278;
  uStack_270 = local_278;
  uStack_26c = local_278;
  local_25c = local_278;
  std::allocator<float>::allocator((allocator<float> *)0x1aadd2);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  std::allocator<float>::~allocator((allocator<float> *)0x1aae06);
  local_3d0 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x1aae13);
  local_3d8._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffff938._0_8_);
  while( true ) {
    local_3e0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffff938._0_8_);
    bVar7 = __gnu_cxx::operator!=(in_stack_fffffffffffff938._8_8_,in_stack_fffffffffffff938._0_8_);
    if (!bVar7) break;
    pNVar9 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_3d8);
    local_3e4 = *(uint *)(pNVar9 + 4);
    if (local_3e4 < local_30c) {
      pNVar9 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_3d8);
      local_3e8 = *(float *)(pNVar9 + 8);
      local_3f0 = Model::GetParameter_v(local_2f0);
      local_3f0 = local_3f0 + local_3e4 * local_35c;
      local_2b8 = local_3e8 * local_2f8;
      local_408 = CONCAT44(local_2b8,local_2b8);
      uStack_400 = CONCAT44(local_2b8,local_2b8);
      for (local_40c = 0; fStack_2b4 = local_2b8, fStack_2b0 = local_2b8, fStack_2ac = local_2b8,
          local_29c = local_2b8, local_40c < local_358; local_40c = local_40c + 4) {
        local_220 = local_3d0 + local_40c;
        uVar1 = *(undefined8 *)local_220;
        uVar2 = *(undefined8 *)(local_220 + 2);
        local_228 = local_3f0 + local_40c;
        local_438 = *(undefined8 *)local_228;
        uStack_430 = *(undefined8 *)(local_228 + 2);
        local_c8._0_4_ = (float)local_438;
        local_c8._4_4_ = (float)((ulong)local_438 >> 0x20);
        uStack_c0._0_4_ = (float)uStack_430;
        uStack_c0._4_4_ = (float)((ulong)uStack_430 >> 0x20);
        local_1d8 = CONCAT44(local_c8._4_4_ * local_2b8,(float)local_c8 * local_2b8);
        uStack_1d0 = CONCAT44(uStack_c0._4_4_ * local_2b8,(float)uStack_c0 * local_2b8);
        local_1c8._0_4_ = (float)uVar1;
        local_1c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_1c0._0_4_ = (float)uVar2;
        uStack_1c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_428 = CONCAT44(local_1c8._4_4_ + local_c8._4_4_ * local_2b8,
                             (float)local_1c8 + (float)local_c8 * local_2b8);
        uStack_420 = CONCAT44(uStack_1c0._4_4_ + uStack_c0._4_4_ * local_2b8,
                              (float)uStack_1c0 + (float)uStack_c0 * local_2b8);
        local_60 = local_3d0 + local_40c;
        *(undefined8 *)local_60 = local_428;
        *(undefined8 *)(local_60 + 2) = uStack_420;
        local_1c8 = uVar1;
        uStack_1c0 = uVar2;
        local_d8 = local_408;
        uStack_d0 = uStack_400;
        local_c8 = local_438;
        uStack_c0 = uStack_430;
        local_78 = local_428;
        uStack_70 = uStack_420;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_3d8);
  }
  local_440._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffff938._0_8_);
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffff938._0_8_);
    bVar7 = __gnu_cxx::operator!=(in_stack_fffffffffffff938._8_8_,in_stack_fffffffffffff938._0_8_);
    if (!bVar7) break;
    pNVar9 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_440);
    uVar11 = *(uint *)(pNVar9 + 4);
    if (uVar11 < local_30c) {
      pNVar9 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_440);
      fVar13 = *(float *)(pNVar9 + 8);
      prVar10 = Model::GetParameter_v(local_2f0);
      uVar11 = uVar11 * local_35c;
      local_2d8 = fVar13 * local_2f8;
      local_f8 = CONCAT44(local_2d8,local_2d8);
      uStack_f0 = CONCAT44(local_2d8,local_2d8);
      local_e8 = local_378;
      uVar1 = local_e8;
      uStack_e0 = uStack_370;
      uVar2 = uStack_e0;
      local_e8._0_4_ = (float)local_378;
      local_e8._4_4_ = (float)((ulong)local_378 >> 0x20);
      uStack_e0._0_4_ = (float)uStack_370;
      uStack_e0._4_4_ = (float)((ulong)uStack_370 >> 0x20);
      fVar13 = (float)local_e8 * local_2d8;
      fVar18 = local_e8._4_4_ * local_2d8;
      fVar19 = (float)uStack_e0 * local_2d8;
      fVar20 = uStack_e0._4_4_ * local_2d8;
      for (local_47c = 0; fStack_2d4 = local_2d8, fStack_2d0 = local_2d8, fStack_2cc = local_2d8,
          local_2bc = local_2d8, local_e8 = uVar1, uStack_e0 = uVar2, local_47c < local_358;
          local_47c = local_47c + 4) {
        local_230 = (undefined1 (*) [16])(local_3d0 + local_47c);
        local_28 = *(undefined8 *)*local_230;
        uStack_20 = *(undefined8 *)(*local_230 + 8);
        local_238 = (undefined1 (*) [16])(prVar10 + (ulong)uVar11 + (ulong)local_47c);
        local_128 = *(undefined8 *)*local_238;
        uStack_120 = *(undefined8 *)(*local_238 + 8);
        local_240 = prVar10 + (ulong)uVar11 + (ulong)local_358 + (ulong)local_47c;
        uVar3 = *(undefined8 *)local_240;
        uVar4 = *(undefined8 *)(local_240 + 2);
        local_108._0_4_ = (float)local_398;
        local_108._4_4_ = (float)((ulong)local_398 >> 0x20);
        uStack_100._0_4_ = (float)uStack_390;
        uStack_100._4_4_ = (float)((ulong)uStack_390 >> 0x20);
        local_118._0_4_ = (float)local_128;
        local_118._4_4_ = (float)((ulong)local_128 >> 0x20);
        uStack_110._0_4_ = (float)uStack_120;
        uStack_110._4_4_ = (float)((ulong)uStack_120 >> 0x20);
        local_38 = CONCAT44(local_118._4_4_ * local_2d8,(float)local_118 * local_2d8);
        uStack_30 = CONCAT44(uStack_110._4_4_ * local_2d8,(float)uStack_110 * local_2d8);
        auVar5._8_8_ = uStack_30;
        auVar5._0_8_ = local_38;
        auVar15 = vsubps_avx(*local_230,auVar5);
        local_618 = auVar15._0_8_;
        uStack_610 = auVar15._8_8_;
        local_158._0_4_ = auVar15._0_4_;
        local_158._4_4_ = auVar15._4_4_;
        uStack_150._0_4_ = auVar15._8_4_;
        uStack_150._4_4_ = auVar15._12_4_;
        local_158._0_4_ = fVar13 * (float)local_158;
        local_158._4_4_ = fVar18 * local_158._4_4_;
        uStack_150._0_4_ = fVar19 * (float)uStack_150;
        uStack_150._4_4_ = fVar20 * uStack_150._4_4_;
        local_1f8 = CONCAT44(local_158._4_4_,(float)local_158);
        uStack_1f0 = CONCAT44(uStack_150._4_4_,(float)uStack_150);
        local_1e8 = CONCAT44(local_108._4_4_ * local_118._4_4_,(float)local_108 * (float)local_118);
        uStack_1e0 = CONCAT44(uStack_100._4_4_ * uStack_110._4_4_,
                              (float)uStack_100 * (float)uStack_110);
        local_158._0_4_ = (float)local_108 * (float)local_118 + (float)local_158;
        local_158._4_4_ = local_108._4_4_ * local_118._4_4_ + local_158._4_4_;
        uStack_150._0_4_ = (float)uStack_100 * (float)uStack_110 + (float)uStack_150;
        uStack_150._4_4_ = uStack_100._4_4_ * uStack_110._4_4_ + uStack_150._4_4_;
        local_198 = CONCAT44(local_158._4_4_,(float)local_158);
        uStack_190 = CONCAT44(uStack_150._4_4_,(float)uStack_150);
        local_218 = CONCAT44(local_158._4_4_ * local_158._4_4_,(float)local_158 * (float)local_158);
        uStack_210 = CONCAT44(uStack_150._4_4_ * uStack_150._4_4_,
                              (float)uStack_150 * (float)uStack_150);
        local_208._0_4_ = (float)uVar3;
        local_208._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_200._0_4_ = (float)uVar4;
        uStack_200._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_b8 = CONCAT44(local_208._4_4_ + local_158._4_4_ * local_158._4_4_,
                            (float)local_208 + (float)local_158 * (float)local_158);
        uStack_b0 = CONCAT44(uStack_200._4_4_ + uStack_150._4_4_ * uStack_150._4_4_,
                             (float)uStack_200 + (float)uStack_150 * (float)uStack_150);
        auVar6._8_8_ = uStack_b0;
        auVar6._0_8_ = local_b8;
        auVar15 = vrsqrtps_avx(auVar6);
        local_678 = auVar15._0_8_;
        uStack_670 = auVar15._8_8_;
        local_188._0_4_ = auVar15._0_4_;
        local_188._4_4_ = auVar15._4_4_;
        uStack_180._0_4_ = auVar15._8_4_;
        uStack_180._4_4_ = auVar15._12_4_;
        local_1b8 = CONCAT44(local_188._4_4_ * local_158._4_4_,(float)local_188 * (float)local_158);
        uStack_1b0 = CONCAT44(uStack_180._4_4_ * uStack_150._4_4_,
                              (float)uStack_180 * (float)uStack_150);
        local_1a8._0_4_ = (float)local_388;
        local_1a8._4_4_ = (float)((ulong)local_388 >> 0x20);
        uStack_1a0._0_4_ = (float)uStack_380;
        uStack_1a0._4_4_ = (float)((ulong)uStack_380 >> 0x20);
        in_stack_fffffffffffff950 = (float)uStack_1a0 * (float)uStack_180 * (float)uStack_150;
        in_stack_fffffffffffff954 = uStack_1a0._4_4_ * uStack_180._4_4_ * uStack_150._4_4_;
        local_58 = CONCAT44(local_1a8._4_4_ * local_188._4_4_ * local_158._4_4_,
                            (float)local_1a8 * (float)local_188 * (float)local_158);
        uStack_50 = CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950);
        auVar15._8_8_ = uStack_50;
        auVar15._0_8_ = local_58;
        in_stack_fffffffffffff938 = vsubps_avx(*local_238,auVar15);
        local_98 = in_stack_fffffffffffff938._0_8_;
        uStack_90 = in_stack_fffffffffffff938._8_8_;
        local_80 = prVar10 + (ulong)uVar11 + (ulong)local_47c;
        *(undefined8 *)local_80 = local_98;
        *(undefined8 *)(local_80 + 2) = uStack_90;
        local_a0 = prVar10 + (ulong)uVar11 + (ulong)local_358 + (ulong)local_47c;
        *(undefined8 *)local_a0 = local_b8;
        *(undefined8 *)(local_a0 + 2) = uStack_b0;
        local_208 = uVar3;
        uStack_200 = uVar4;
        local_1a8 = local_388;
        uStack_1a0 = uStack_380;
        local_188 = local_678;
        uStack_180 = uStack_670;
        local_178 = local_198;
        uStack_170 = uStack_190;
        local_168 = local_198;
        uStack_160 = uStack_190;
        local_158 = local_618;
        uStack_150 = uStack_610;
        local_148 = CONCAT44(fVar18,fVar13);
        uStack_140 = CONCAT44(fVar20,fVar19);
        local_138 = local_f8;
        uStack_130 = uStack_f0;
        local_118 = local_128;
        uStack_110 = uStack_120;
        local_108 = local_398;
        uStack_100 = uStack_390;
        local_48 = local_128;
        uStack_40 = uStack_120;
        local_18 = local_b8;
        uStack_10 = uStack_b0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_440);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
  return;
}

Assistant:

void FMScore::calc_grad_adagrad(const SparseRow* row,
                                Model& model,
                                real_t pg,
                                real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
      iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMwg = _mm_load_ps(w+aligned_k+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
      _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMwg = _mm_add_ps(XMMwg, _mm_mul_ps(XMMg, XMMg));
      XMMw = _mm_sub_ps(XMMw,
             _mm_mul_ps(XMMlr,
             _mm_mul_ps(_mm_rsqrt_ps(XMMwg), XMMg)));
      _mm_store_ps(w+d, XMMw);
      _mm_store_ps(w+aligned_k+d, XMMwg);
    }
  }
}